

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void linearize_assignment(Proc *proc,AstNodeList *expr_list,node_info *varinfo,int nv)

{
  uint line_number;
  int iVar1;
  VariableType *pVVar2;
  VariableType *pVVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  AstNode *expr;
  PtrList *pseudo;
  PtrList *src;
  PtrList *pPVar10;
  Pseudo *val_pseudo;
  Pseudo *val_pseudo_00;
  Instruction *insn;
  undefined8 *puVar11;
  Pseudo **ppPVar12;
  ravitype_t type;
  opcode op;
  Pseudo *pPVar13;
  PtrListIterator *pPVar14;
  ulong uVar15;
  long alStack_b8 [2];
  undefined1 local_a8 [8];
  PtrListIterator expriter__;
  int local_60;
  
  alStack_b8[1] = 0x118c14;
  uVar7 = raviX_ptrlist_size((PtrList *)expr_list);
  lVar9 = (long)(int)uVar7;
  lVar5 = lVar9 * -0x10;
  lVar6 = lVar5 + -0xa8;
  expriter__._16_8_ = lVar9;
  *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118c47;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_a8,(PtrList *)expr_list);
  line_number = 0;
  pPVar14 = (PtrListIterator *)((long)&expriter__ + lVar9 * -0x10);
  *(undefined8 *)(local_a8 + lVar5 + -8) = 1;
  pseudo = (PtrList *)0x0;
  local_60 = (int)*(undefined8 *)(local_a8 + lVar5 + -8);
  while( true ) {
    *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118c76;
    expr = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_a8);
    if (expr == (AstNode *)0x0) break;
    if (line_number == 0) {
      line_number = expr->line_number;
    }
    *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118c9b;
    pseudo = (PtrList *)linearize_expression(proc,expr);
    uVar8 = *(uint *)pseudo;
    src = pseudo;
    if ((uVar8 & 0xf) == 0xe) {
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118cb8;
      src = (PtrList *)indexed_load(proc,(Pseudo *)pseudo);
      uVar8 = *(uint *)src;
    }
    *(anon_union_72_25_595a31af_for_AstNode_2 **)&pPVar14[-1].__nr = &expr->field_2;
    pPVar10 = src;
    if ((uVar8 & 0xf) == 0) {
      pPVar10 = src->prev_;
      uVar8 = *(uint *)&pPVar10->field_0x0;
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0xffffffffffffffff;
      type = (ravitype_t)*(undefined8 *)(local_a8 + lVar5 + -8);
      if ((uVar8 < 2) &&
         (iVar1 = *(int *)&pPVar10->prev_, type = -(uint)(iVar1 != 0x10) | RAVI_TNUMFLT, iVar1 == 8)
         ) {
        type = RAVI_TNUMINT;
      }
      uVar8 = expr->line_number;
      *(undefined8 *)(local_a8 + lVar5 + -8) = 1;
      uVar4 = *(undefined8 *)(local_a8 + lVar5 + -8);
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118d09;
      pPVar10 = (PtrList *)allocate_temp_pseudo(proc,type,SUB81(uVar4,0));
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x4a;
      uVar4 = *(undefined8 *)(local_a8 + lVar5 + -8);
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118d20;
      instruct_move(proc,(opcode)uVar4,(Pseudo *)pPVar10,(Pseudo *)src,uVar8);
    }
    pPVar14->__head = pPVar10;
    if ((local_60 < (int)uVar7) &&
       (((undefined1  [88])*src & (undefined1  [88])0xf) == (undefined1  [88])0xb)) {
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118d45;
      convert_range_to_temp((Pseudo *)src);
    }
    local_60 = local_60 + 1;
    pPVar14 = (PtrListIterator *)&pPVar14->__nr;
  }
  *(undefined8 *)(local_a8 + lVar5 + -8) = 1;
  uVar4 = *(undefined8 *)(local_a8 + lVar5 + -8);
  *(undefined8 *)(local_a8 + lVar5 + -8) = 8;
  lVar9 = *(long *)(local_a8 + lVar5 + -8);
  uVar15 = 0;
  do {
    if ((uint)(~(nv >> 0x1f) & nv) == uVar15) {
      puVar11 = (undefined8 *)(local_a8 + (ulong)uVar7 * 0x10 + lVar6 + 0xa0);
      for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        pPVar13 = (Pseudo *)*puVar11;
        *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118f37;
        free_temp_pseudo(proc,pPVar13,false);
        puVar11 = puVar11 + -2;
      }
      ppPVar12 = &varinfo[(ulong)(uint)nv - 1].pseudo;
      for (; 0 < nv; nv = nv + -1) {
        pPVar13 = *ppPVar12;
        *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118f62;
        free_temp_pseudo(proc,pPVar13,false);
        ppPVar12 = ppPVar12 + -2;
      }
      if ((pseudo != (PtrList *)0x0) &&
         (((undefined1  [88])*pseudo & (undefined1  [88])0xf) == (undefined1  [88])0xb)) {
        *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118f88;
        free_temp_pseudo(proc,(Pseudo *)pseudo,false);
      }
      return;
    }
    if ((long)uVar15 < (long)expriter__._16_8_) {
      pPVar13 = *(Pseudo **)(local_a8 + lVar9 + lVar6 + 0xa8);
      if (((undefined1  [48])*pPVar13 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
        if (uVar7 - 1 != uVar15) {
          *(code **)(local_a8 + lVar5 + -8) = linearize_store_var;
          __assert_fail("i == note_ne-1",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                        ,0x738,
                        "void linearize_assignment(Proc *, AstNodeList *, struct node_info *, int)")
          ;
        }
        *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118dce;
        val_pseudo = raviX_allocate_range_select_pseudo(proc,pPVar13,0);
        *(Pseudo **)(local_a8 + lVar9 + lVar6 + 0xa8) = val_pseudo;
        val_pseudo_00 = pPVar13;
      }
      else {
        val_pseudo_00 = (Pseudo *)0x0;
        val_pseudo = pPVar13;
      }
      pVVar2 = *(VariableType **)(local_a8 + lVar9 + lVar5 + -8);
      pVVar3 = *(VariableType **)((long)varinfo + lVar9 + -8);
      pPVar13 = *(Pseudo **)((long)&varinfo->vartype + lVar9);
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118e9b;
      linearize_store_var(proc,pVVar3,pPVar13,pVVar2,val_pseudo,line_number);
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118ea8;
      free_temp_pseudo(proc,val_pseudo,false);
      if (val_pseudo_00 != (Pseudo *)0x0) {
LAB_00118eb4:
        *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118ec1;
        free_temp_pseudo(proc,val_pseudo_00,false);
      }
    }
    else {
      if ((pseudo != (PtrList *)0x0) &&
         (((undefined1  [88])*pseudo & (undefined1  [88])0xf) == (undefined1  [88])0xb)) {
        *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118e03;
        val_pseudo_00 =
             raviX_allocate_range_select_pseudo
                       (proc,(Pseudo *)pseudo,((int)uVar4 - uVar7) + (int)uVar15);
        pVVar2 = *(VariableType **)((long)varinfo + lVar9 + -8);
        pPVar13 = *(Pseudo **)((long)&varinfo->vartype + lVar9);
        pVVar3 = (VariableType *)alStack_b8[0];
        *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118e2a;
        linearize_store_var(proc,pVVar2,pPVar13,pVVar3,val_pseudo_00,line_number);
        goto LAB_00118eb4;
      }
      iVar1 = **(int **)((long)varinfo + lVar9 + -8);
      if (((iVar1 == 0x20) || (iVar1 == 0x80)) || (iVar1 == 0x40)) {
        pPVar13 = *(Pseudo **)((long)&varinfo->vartype + lVar9);
        op = (iVar1 == 0x40) + 0x3b + (uint)(iVar1 == 0x40);
        *(undefined8 *)(local_a8 + lVar5 + -8) = 0x3c;
        if (iVar1 == 0x20) {
          op = (opcode)*(undefined8 *)(local_a8 + lVar5 + -8);
        }
      }
      else {
        pPVar13 = *(Pseudo **)((long)&varinfo->vartype + lVar9);
        *(undefined8 *)(local_a8 + lVar5 + -8) = 0x5d;
        op = (opcode)*(undefined8 *)(local_a8 + lVar5 + -8);
      }
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118ede;
      insn = allocate_instruction(proc,op,line_number);
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118ef2;
      add_instruction_target(proc,insn,pPVar13);
      *(undefined8 *)(local_a8 + lVar5 + -8) = 0x118efd;
      add_instruction(proc,insn);
    }
    uVar15 = uVar15 + 1;
    lVar9 = lVar9 + 0x10;
  } while( true );
}

Assistant:

static void linearize_assignment(Proc *proc, AstNodeList *expr_list, struct node_info *varinfo, int nv)
{
	AstNode *expr;

	// Process RHS expressions
	int ne = raviX_ptrlist_size((const PtrList *)expr_list);
	struct node_info *valinfo = (struct node_info *)alloca(ne * sizeof(struct node_info));
	Pseudo *last_val_pseudo = NULL;
	int i = 0;
	unsigned line_number = 0;
	FOR_EACH_PTR(expr_list, AstNode, expr)
	{
		line_number = line_number == 0 ? expr->line_number : line_number;
		Pseudo *val_pseudo = last_val_pseudo = linearize_expression(proc, expr);
		if (val_pseudo->type == PSEUDO_INDEXED)
			val_pseudo = indexed_load(proc, val_pseudo);
		valinfo[i].vartype = &expr->common_expr.type;
		// To support the Lua semantics of x,y = y,x as a swap
		// we need to copy locals to temps
		// TODO can this be optimized to only do when needed
		// See also check_conflict() in Lua parser
		valinfo[i].pseudo = copy_to_temp_if_necessary(proc, val_pseudo, expr->line_number);
		i++;
		if (i < ne && val_pseudo->type == PSEUDO_RANGE) {
			convert_range_to_temp(val_pseudo);
		}
	}
	END_FOR_EACH_PTR(expr)

	/* TODO do we need to insert type assertions in some cases such as function return values ? */

	int note_ne = ne;
	// nv = number of variables (LHS)
	// ne = number of expressions (RHS)
	for (i = 0; i < nv; i++) {
		if (i >= ne) {
			// Went past ne
			if (last_val_pseudo != NULL && last_val_pseudo->type == PSEUDO_RANGE) {
				int pick = i - ne + 1;
				Pseudo *range_select_pseudo = raviX_allocate_range_select_pseudo(proc, last_val_pseudo, pick);
				linearize_store_var(proc, varinfo[i].vartype, varinfo[i].pseudo,
						    valinfo[ne-1].vartype,
				    range_select_pseudo, line_number);
				free_temp_pseudo(proc, range_select_pseudo, false);
			} else {
				if (varinfo[i].vartype->type_code == RAVI_TTABLE ||
				    varinfo[i].vartype->type_code == RAVI_TARRAYFLT ||
				    varinfo[i].vartype->type_code == RAVI_TARRAYINT) {
					linearize_table_constructor_inplace(proc, varinfo[i].pseudo, varinfo[i].vartype->type_code, line_number);
				}
				else {
					linearize_init(proc, varinfo[i].pseudo, line_number);
				}
			}
		}
		else {
			Pseudo *range_pseudo = NULL;
			if (valinfo[i].pseudo->type == PSEUDO_RANGE) {
				/* Only the topmost expression can be a range ... assert */
				assert(i == note_ne-1);
				range_pseudo = valinfo[i].pseudo;
				valinfo[i].pseudo = raviX_allocate_range_select_pseudo(proc, valinfo[i].pseudo, 0);
			}
			linearize_store_var(proc, varinfo[i].vartype, varinfo[i].pseudo,
					    valinfo[i].vartype, valinfo[i].pseudo, line_number);
			free_temp_pseudo(proc, valinfo[i].pseudo, false);
			if (range_pseudo) {
				free_temp_pseudo(proc, range_pseudo, false);
			}
		}
	}

	for (int i = ne-1; i >= 0; i--) {
		free_temp_pseudo(proc, valinfo[i].pseudo, false);
	}
	for (int i = nv-1; i >= 0; i--) {
		free_temp_pseudo(proc, varinfo[i].pseudo, false);
	}
	if (last_val_pseudo != NULL && last_val_pseudo->type == PSEUDO_RANGE) {
		free_temp_pseudo(proc, last_val_pseudo, false);
	}
	return;
}